

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCTestResourceSpec.cxx
# Opt level: O2

int testCTestResourceSpec(int argc,char **argv)

{
  ReadFileResult result;
  pointer pEVar1;
  bool bVar2;
  ReadFileResult result_00;
  ostream *poVar3;
  int iVar4;
  char *pcVar5;
  pointer pEVar6;
  allocator<char> local_80 [8];
  undefined4 local_78 [2];
  undefined8 local_70;
  undefined4 *local_68;
  undefined4 *local_60;
  undefined8 local_58;
  string path;
  
  pEVar1 = expectedResourceSpecs.super__Vector_base<ExpectedSpec,_std::allocator<ExpectedSpec>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (argc < 2) {
    std::operator<<((ostream *)&std::cout,"Invalid arguments.\n");
    iVar4 = -1;
  }
  else {
    iVar4 = 0;
    for (pEVar6 = expectedResourceSpecs.
                  super__Vector_base<ExpectedSpec,_std::allocator<ExpectedSpec>_>._M_impl.
                  super__Vector_impl_data._M_start; pEVar6 != pEVar1; pEVar6 = pEVar6 + 1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&path,argv[1],local_80);
      std::__cxx11::string::append((char *)&path);
      std::__cxx11::string::append((string *)&path);
      result = pEVar6->ParseResult;
      local_78[0] = 0;
      local_70 = 0;
      local_68 = local_78;
      local_58 = 0;
      local_60 = local_68;
      result_00 = cmCTestResourceSpec::ReadFromJSONFile((cmCTestResourceSpec *)local_80,&path);
      if (result_00 == result) {
        bVar2 = cmCTestResourceSpec::operator!=((cmCTestResourceSpec *)local_80,&pEVar6->Expected);
        if (bVar2) {
          poVar3 = std::operator<<((ostream *)&std::cout,"ReadFromJSONFile(\"");
          poVar3 = std::operator<<(poVar3,(string *)&path);
          pcVar5 = "\") did not give expected spec";
          goto LAB_00164412;
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"ReadFromJSONFile(\"");
        poVar3 = std::operator<<(poVar3,(string *)&path);
        poVar3 = std::operator<<(poVar3,"\") returned \"");
        pcVar5 = cmCTestResourceSpec::ResultToString(result_00);
        poVar3 = std::operator<<(poVar3,pcVar5);
        poVar3 = std::operator<<(poVar3,"\", should be \"");
        pcVar5 = cmCTestResourceSpec::ResultToString(result);
        poVar3 = std::operator<<(poVar3,pcVar5);
        pcVar5 = "\"";
LAB_00164412:
        poVar3 = std::operator<<(poVar3,pcVar5);
        std::endl<char,std::char_traits<char>>(poVar3);
        iVar4 = -1;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>
                   *)local_80);
      std::__cxx11::string::~string((string *)&path);
    }
  }
  return iVar4;
}

Assistant:

int testCTestResourceSpec(int argc, char** const argv)
{
  if (argc < 2) {
    std::cout << "Invalid arguments.\n";
    return -1;
  }

  int retval = 0;
  for (auto const& spec : expectedResourceSpecs) {
    std::string path = argv[1];
    path += "/testCTestResourceSpec_data/";
    path += spec.Path;
    if (!testSpec(path, spec.ParseResult, spec.Expected)) {
      retval = -1;
    }
  }

  return retval;
}